

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

void __thiscall minibag::View::iterator::~iterator(iterator *this)

{
  pointer pVVar1;
  
  if (this->message_instance_ != (MessageInstance *)0x0) {
    operator_delete(this->message_instance_,0x28);
  }
  pVVar1 = (this->iters_).
           super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)(this->iters_).
                                 super__Vector_base<minibag::ViewIterHelper,_std::allocator<minibag::ViewIterHelper>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar1);
    return;
  }
  return;
}

Assistant:

View::iterator::~iterator()
{
  if (message_instance_ != NULL)
    delete message_instance_;
}